

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressSeqStore_singleBlock
                 (ZSTD_CCtx *zc,seqStore_t *seqStore,repcodes_t *dRep,repcodes_t *cRep,void *dst,
                 size_t dstCapacity,void *src,size_t srcSize,U32 lastBlock,U32 isPartition)

{
  uint uVar1;
  int iVar2;
  void *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  seqStore_t *in_R8;
  ulong in_R9;
  ZSTD_entropyCTables_t *in_stack_00000008;
  undefined8 in_stack_00000010;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  repcodes_t dRepOriginal;
  size_t cSeqsSize;
  size_t cSize;
  BYTE *ip;
  BYTE *op;
  U32 rleMaxLength;
  U32 lastBlock_00;
  size_t blockSize;
  void *src_00;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff74;
  void *in_stack_ffffffffffffff78;
  seqStore_t *in_stack_ffffffffffffff80;
  repcodes_t *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ZSTD_CCtx_params *in_stack_ffffffffffffffa0;
  ZSTD_CCtx *pZVar7;
  ZSTD_entropyCTables_t *in_stack_ffffffffffffffa8;
  seqStore_t *srcSize_00;
  ZSTD_CCtx *local_8;
  
  uVar4 = (undefined4)*in_RDX;
  uVar5 = (undefined4)((ulong)*in_RDX >> 0x20);
  uVar6 = *(undefined4 *)(in_RDX + 1);
  srcSize_00 = in_R8;
  if ((int)err_code_2 != 0) {
    ZSTD_seqStore_resolveOffCodes
              ((repcodes_t *)CONCAT44(uVar4,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,(U32)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  }
  if (in_R9 < 3) {
    local_8 = (ZSTD_CCtx *)0xffffffffffffffba;
  }
  else {
    blockSize = *(size_t *)(in_RDI + 0xda8);
    uVar3 = *(undefined4 *)(in_RDI + 8);
    src_00 = (void *)0x22d8;
    local_8 = (ZSTD_CCtx *)
              ZSTD_entropyCompressSeqStore
                        (in_R8,in_stack_00000008,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                         ,(void *)CONCAT44(uVar6,uVar5),CONCAT44(uVar4,in_stack_ffffffffffffff90),
                         (size_t)srcSize_00,in_RCX,(size_t)in_RDX,in_ESI);
    pZVar7 = local_8;
    uVar1 = ERR_isError((size_t)local_8);
    if (uVar1 == 0) {
      if (((*(int *)(in_RDI + 0x398) == 0) && (pZVar7 < (ZSTD_CCtx *)0x19)) &&
         (iVar2 = ZSTD_isRLE((BYTE *)CONCAT44(uVar6,uVar5),CONCAT44(uVar4,in_stack_ffffffffffffff90)
                            ), iVar2 != 0)) {
        pZVar7 = (ZSTD_CCtx *)0x1;
      }
      if (*(int *)(in_RDI + 0x378) == 0) {
        lastBlock_00 = (U32)((ulong)in_stack_00000010 >> 0x20);
        if (pZVar7 == (ZSTD_CCtx *)0x0) {
          pZVar7 = (ZSTD_CCtx *)
                   ZSTD_noCompressBlock
                             (in_stack_ffffffffffffff78,CONCAT44(in_stack_ffffffffffffff74,uVar3),
                              src_00,blockSize,lastBlock_00);
          local_8 = pZVar7;
          uVar1 = ERR_isError((size_t)pZVar7);
          if (uVar1 != 0) {
            return (size_t)pZVar7;
          }
          *in_RDX = CONCAT44(uVar5,uVar4);
          *(undefined4 *)(in_RDX + 1) = uVar6;
        }
        else if (pZVar7 == (ZSTD_CCtx *)0x1) {
          pZVar7 = (ZSTD_CCtx *)
                   ZSTD_rleCompressBlock
                             (local_8,(size_t)in_stack_ffffffffffffff80,
                              (BYTE)((ulong)in_stack_ffffffffffffff78 >> 0x38),
                              CONCAT44(in_stack_ffffffffffffff74,uVar3),(U32)((ulong)src_00 >> 0x20)
                             );
          local_8 = pZVar7;
          uVar1 = ERR_isError((size_t)pZVar7);
          if (uVar1 != 0) {
            return (size_t)pZVar7;
          }
          *in_RDX = CONCAT44(uVar5,uVar4);
          *(undefined4 *)(in_RDX + 1) = uVar6;
        }
        else {
          ZSTD_blockState_confirmRepcodesAndEntropyTables((ZSTD_blockState_t *)(in_RDI + 0xc68));
          writeBlockHeader((void *)CONCAT44(in_stack_ffffffffffffff74,uVar3),(size_t)src_00,
                           blockSize,lastBlock_00);
          local_8 = (ZSTD_CCtx *)((long)&pZVar7->stage + 3);
        }
        if (*(int *)(*(long *)(in_RDI + 0xc68) + 0x15e4) == 2) {
          *(undefined4 *)(*(long *)(in_RDI + 0xc68) + 0x15e4) = 1;
        }
      }
      else {
        ZSTD_copyBlockSequences(pZVar7);
        ZSTD_blockState_confirmRepcodesAndEntropyTables((ZSTD_blockState_t *)(in_RDI + 0xc68));
        local_8 = (ZSTD_CCtx *)0x0;
      }
    }
  }
  return (size_t)local_8;
}

Assistant:

static size_t
ZSTD_compressSeqStore_singleBlock(ZSTD_CCtx* zc,
                            const seqStore_t* const seqStore,
                                  repcodes_t* const dRep, repcodes_t* const cRep,
                                  void* dst, size_t dstCapacity,
                            const void* src, size_t srcSize,
                                  U32 lastBlock, U32 isPartition)
{
    const U32 rleMaxLength = 25;
    BYTE* op = (BYTE*)dst;
    const BYTE* ip = (const BYTE*)src;
    size_t cSize;
    size_t cSeqsSize;

    /* In case of an RLE or raw block, the simulated decompression repcode history must be reset */
    repcodes_t const dRepOriginal = *dRep;
    DEBUGLOG(5, "ZSTD_compressSeqStore_singleBlock");
    if (isPartition)
        ZSTD_seqStore_resolveOffCodes(dRep, cRep, seqStore, (U32)(seqStore->sequences - seqStore->sequencesStart));

    RETURN_ERROR_IF(dstCapacity < ZSTD_blockHeaderSize, dstSize_tooSmall, "Block header doesn't fit");
    cSeqsSize = ZSTD_entropyCompressSeqStore(seqStore,
                &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
                &zc->appliedParams,
                op + ZSTD_blockHeaderSize, dstCapacity - ZSTD_blockHeaderSize,
                srcSize,
                zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
                zc->bmi2);
    FORWARD_IF_ERROR(cSeqsSize, "ZSTD_entropyCompressSeqStore failed!");

    if (!zc->isFirstBlock &&
        cSeqsSize < rleMaxLength &&
        ZSTD_isRLE((BYTE const*)src, srcSize)) {
        /* We don't want to emit our first block as a RLE even if it qualifies because
        * doing so will cause the decoder (cli only) to throw a "should consume all input error."
        * This is only an issue for zstd <= v1.4.3
        */
        cSeqsSize = 1;
    }

    if (zc->seqCollector.collectSequences) {
        ZSTD_copyBlockSequences(zc);
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    if (cSeqsSize == 0) {
        cSize = ZSTD_noCompressBlock(op, dstCapacity, ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "Nocompress block failed");
        DEBUGLOG(4, "Writing out nocompress block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else if (cSeqsSize == 1) {
        cSize = ZSTD_rleCompressBlock(op, dstCapacity, *ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "RLE compress block failed");
        DEBUGLOG(4, "Writing out RLE block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        writeBlockHeader(op, cSeqsSize, srcSize, lastBlock);
        cSize = ZSTD_blockHeaderSize + cSeqsSize;
        DEBUGLOG(4, "Writing out compressed block, size: %zu", cSize);
    }

    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}